

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O1

void select_tx_block(AV1_COMP *cpi,MACROBLOCK *x,int blk_row,int blk_col,int block,TX_SIZE tx_size,
                    int depth,BLOCK_SIZE plane_bsize,ENTROPY_CONTEXT *ta,ENTROPY_CONTEXT *tl,
                    TXFM_CONTEXT *tx_above,TXFM_CONTEXT *tx_left,RD_STATS *rd_stats,
                    int64_t prev_level_rd,int64_t ref_best_rd,int *is_cost_valid,
                    FAST_TX_SEARCH_MODE ftxs_mode)

{
  byte bVar1;
  MB_MODE_INFO *pMVar2;
  uint8_t *puVar3;
  short *psVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char cVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  undefined4 in_register_0000000c;
  long lVar13;
  TX_SIZE TVar14;
  ulong uVar15;
  int16_t *piVar16;
  uint8_t uVar17;
  int iVar18;
  undefined7 uVar21;
  ulong uVar19;
  ulong uVar20;
  int iVar22;
  MACROBLOCK *pMVar23;
  NN_CONFIG *pNVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  byte bVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  ENTROPY_CONTEXT *__s;
  uint uVar36;
  int16_t *data;
  uint uVar37;
  int c;
  int iVar38;
  ulong uVar39;
  bool bVar40;
  byte bVar41;
  float fVar42;
  float fVar43;
  TXFM_CONTEXT *pTVar44;
  float fVar45;
  double dVar46;
  double dVar47;
  float fVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  NN_CONFIG *local_228;
  int local_204;
  int x_sum;
  int16_t *local_1b0;
  ulong local_1a8;
  undefined8 local_1a0;
  TXFM_CONTEXT *local_198;
  double dStack_190;
  undefined4 local_184;
  long local_180;
  long local_178;
  MACROBLOCK *local_170;
  int16_t *local_168;
  ulong local_160;
  long local_158;
  ulong local_150;
  int16_t *local_148;
  ulong local_140;
  float features [64];
  
  local_1a0 = CONCAT44(in_register_0000000c,blk_col);
  rd_stats->rate = 0;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0;
  rd_stats->rdcost = 0;
  rd_stats->sse = 0;
  rd_stats->skip_txfm = '\x01';
  if (ref_best_rd < 0) {
    *is_cost_valid = 0;
    return;
  }
  local_180 = (long)blk_col;
  local_1b0 = (int16_t *)(long)blk_row;
  uVar39 = (ulong)tx_size;
  uVar32 = *(uint *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
  uVar36 = *(uint *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
  local_1a8 = (ulong)uVar36;
  pMVar2 = *(x->e_mbd).mi;
  if (tx_size == '\0') {
    lVar28 = 0;
  }
  else {
    bVar41 = block_size_high[pMVar2->bsize];
    if (block_size_high[pMVar2->bsize] < block_size_wide[pMVar2->bsize]) {
      bVar41 = block_size_wide[pMVar2->bsize];
    }
    bVar29 = 1;
    if (bVar41 < 0x20) {
      if (bVar41 == 8) {
        TVar14 = '\x01';
        bVar40 = false;
        bVar29 = 0;
      }
      else {
        if (bVar41 == 0x10) {
          TVar14 = '\x02';
          goto LAB_0023f9a6;
        }
LAB_0023f9b3:
        bVar40 = true;
        TVar14 = '\0';
        bVar29 = 1;
      }
    }
    else {
      TVar14 = '\x04';
      bVar40 = false;
      if ((bVar41 != 0x80) && (bVar41 != 0x40)) {
        if (bVar41 != 0x20) goto LAB_0023f9b3;
        TVar14 = '\x03';
LAB_0023f9a6:
        bVar40 = false;
      }
    }
    lVar28 = 0x3f;
    if (!bVar40) {
      lVar28 = (ulong)(byte)((bVar29 & ""[uVar39] != TVar14) + TVar14 * -2 + 8) * 3;
    }
    lVar28 = (ulong)((uint)tx_left[(long)local_1b0] < (uVar36 & 0xff)) +
             (ulong)((uint)tx_above[local_180] < (uVar32 & 0xff)) + lVar28;
  }
  local_140 = (ulong)(uint)depth;
  if ((((cpi->oxcf).txfm_cfg.enable_tx64 != false) ||
      (bVar40 = false, (0x61810UL >> (uVar39 & 0x3f) & 1) == 0)) &&
     (bVar40 = true, (cpi->oxcf).txfm_cfg.enable_rect_tx == false)) {
    bVar40 = uVar32 == uVar36;
  }
  bVar41 = tx_size != '\0';
  uVar10 = (ulong)plane_bsize;
  uVar30 = (uint)(depth < 2 && (bool)bVar41);
  uVar31 = uVar30;
  if (((depth < 2 && (bool)bVar41) && (bVar40)) &&
     (lVar11 = (long)(cpi->sf).tx_sf.prune_tx_size_level, 0 < lVar11)) {
    bVar29 = block_size_wide[uVar10];
    piVar16 = x->plane[0].src_diff + (long)local_1b0 * (ulong)bVar29 * 4 + (long)(blk_col * 4);
    uVar37 = (int)uVar36 >> ((int)uVar32 <= (int)uVar36);
    uVar36 = (int)uVar32 >> ((int)uVar36 <= (int)uVar32);
    local_168 = (int16_t *)(double)(int)(uVar36 * uVar37);
    local_158 = (ulong)bVar29 * (ulong)uVar37 * 2;
    dVar46 = 0.0;
    dVar47 = 0.0;
    fVar45 = 0.0;
    uVar35 = 0;
    iVar25 = 0;
    lVar13 = 0;
    uVar19 = 0;
    fVar48 = 0.0;
    local_178 = lVar11;
    local_170 = x;
    do {
      iVar38 = 0;
      local_150 = uVar35;
      local_148 = piVar16;
      do {
        local_228 = (NN_CONFIG *)(ulong)(uint)fVar45;
        local_198 = (TXFM_CONTEXT *)dVar46;
        dStack_190 = dVar47;
        local_160 = uVar19;
        (*aom_get_blk_sse_sum)(piVar16,(uint)bVar29,uVar36,uVar37,&x_sum,(int64_t *)features);
        x = local_170;
        lVar11 = local_178;
        bVar41 = (byte)uVar32;
        fVar43 = (float)x_sum / (float)(int)(uVar36 * uVar37);
        fVar42 = (float)((double)CONCAT44(features[1],features[0]) / (double)local_168) -
                 fVar43 * fVar43;
        iVar25 = iVar25 + x_sum;
        fVar45 = fVar45 + fVar42;
        fVar48 = fVar48 + fVar43;
        dVar46 = (double)local_198 + (double)(fVar42 * fVar42);
        dVar47 = dStack_190 + (double)(fVar43 * fVar43);
        lVar13 = lVar13 + CONCAT44(features[1],features[0]);
        iVar18 = (int)local_160;
        uVar19 = (ulong)(iVar18 + 1);
        iVar38 = iVar38 + uVar36;
        piVar16 = piVar16 + uVar36;
      } while (iVar38 < (int)uVar32);
      uVar35 = local_150 + uVar37;
      piVar16 = (int16_t *)((long)local_148 + local_158);
    } while (uVar35 < local_1a8);
    if (iVar18 < 1) {
      fVar48 = 0.0;
      fVar45 = 0.0;
    }
    else {
      iVar38 = (int)local_1a8 * uVar32;
      fVar42 = (float)iVar25 / (float)iVar38;
      fVar43 = (float)lVar13 / (float)iVar38 - fVar42 * fVar42;
      fVar48 = (fVar48 + fVar42) / 5.0;
      pTVar44 = (TXFM_CONTEXT *)((double)(fVar43 * fVar43) + dVar46);
      dVar46 = (double)(iVar18 + 2);
      fVar42 = (float)((dVar47 + (double)(fVar42 * fVar42)) / dVar46) - fVar48 * fVar48;
      fVar48 = 0.0;
      if (0.0 < fVar42) {
        if (fVar42 < 0.0) {
          local_228 = (NN_CONFIG *)(ulong)(uint)(fVar45 + fVar43);
          local_198 = pTVar44;
          fVar48 = sqrtf(fVar42);
          pTVar44 = local_198;
        }
        else {
          fVar48 = SQRT(fVar42);
        }
      }
      fVar45 = (fVar45 + fVar43) / (float)(iVar18 + 2);
      fVar45 = (float)((double)pTVar44 / dVar46) - fVar45 * fVar45;
    }
    psVar4 = x->plane[0].dequant_QTX;
    iVar38 = (int)*psVar4 >> 3;
    iVar25 = (int)psVar4[1] >> 3;
    if ((fVar48 <= (float)iVar38) &&
       (bVar41 = (byte)(iVar25 * iVar25),
       (float)*(int *)(&DAT_00512c30 + lVar11 * 4) * fVar45 <= (float)(iVar25 * iVar25))) {
      uVar31 = 0;
    }
    if (((float)(iVar38 * *(int *)(&DAT_00512c20 + lVar11 * 4)) < fVar48) &&
       ((float)(iVar25 * iVar25 * *(int *)(&DAT_00512c20 + lVar11 * 4)) < fVar45)) {
      bVar40 = false;
    }
  }
  piVar16 = local_1b0;
  if ((((cpi->sf).rt_sf.skip_tx_no_split_var_based_partition != 0) && (uVar31 != 0)) &&
     (x->try_merge_partition != 0)) {
    bVar41 = 0;
    if (x->plane[0].eobs[block] != 0) {
      bVar40 = false;
    }
  }
  local_168 = (int16_t *)(ulong)ftxs_mode;
  uVar21 = (undefined7)((ulong)rd_stats >> 8);
  if (bVar40) {
    local_198 = (TXFM_CONTEXT *)CONCAT44(local_198._4_4_,uVar31);
    local_228 = (NN_CONFIG *)*(x->e_mbd).mi;
    bVar41 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar10];
    bVar29 = ""[uVar39];
    bVar1 = ""[uVar39];
    get_txb_ctx(plane_bsize,tx_size,0,ta + local_180,tl + (long)local_1b0,(TXB_CTX *)&x_sum);
    data = local_168;
    iVar38 = (x->coeff_costs).coeff_costs[(uint)bVar29 + (uint)bVar1 + 1 >> 1 & 0xff][0].
             txb_skip_cost[x_sum][1];
    rd_stats->zero_rate = iVar38;
    *(TX_SIZE *)
     ((long)local_228->bias +
     (long)(((int)local_1a0 >> (av1_get_txb_size_index_tw_w_log2_table[uVar10] & 0x1f)) +
           (((int)piVar16 >> (av1_get_txb_size_index_tw_h_log2_table[uVar10] & 0x1f)) <<
           (av1_get_txb_size_index_stride_log2_table[uVar10] & 0x1f))) + 2) = tx_size;
    pMVar23 = x;
    search_tx_type(cpi,x,0,block,(int)piVar16,(int)local_1a0,plane_bsize,tx_size,(TXB_CTX *)&x_sum,
                   (FAST_TX_SEARCH_MODE)local_168,0,ref_best_rd,(RD_STATS *)features);
    if (((long)rd_stats->rate == 0x7fffffff) || ((long)(int)features[0] == 0x7fffffff)) {
      rd_stats->rate = 0x7fffffff;
      rd_stats->zero_rate = 0;
      rd_stats->dist = 0x7fffffffffffffff;
      rd_stats->rdcost = 0x7fffffffffffffff;
      rd_stats->sse = 0x7fffffffffffffff;
      rd_stats->skip_txfm = '\0';
    }
    else {
      lVar11 = (long)(int)features[0] + (long)rd_stats->rate;
      if (0x7ffffffe < lVar11) {
        lVar11 = 0x7fffffff;
      }
      rd_stats->rate = (int)lVar11;
      if (rd_stats->zero_rate == 0) {
        rd_stats->zero_rate = (int)features[1];
      }
      rd_stats->dist = rd_stats->dist + features._8_8_;
      if ((rd_stats->sse != 0x7fffffffffffffff) && (features._24_8_ != 0x7fffffffffffffff)) {
        rd_stats->sse = features._24_8_ + rd_stats->sse;
      }
      rd_stats->skip_txfm = rd_stats->skip_txfm & features[8]._0_1_;
    }
    if ((x->e_mbd).lossless[*(ushort *)((long)local_228->bias + 0x17) & 7] == 0) {
      bVar40 = true;
      if (rd_stats->skip_txfm != '\x01') {
        pMVar23 = (MACROBLOCK *)0x0;
        bVar40 = rd_stats->sse * 0x80 + ((long)iVar38 * (long)x->rdmult + 0x100 >> 9) <=
                 rd_stats->dist * 0x80 + ((long)rd_stats->rate * (long)x->rdmult + 0x100 >> 9);
      }
    }
    else {
      bVar40 = false;
    }
    iVar25 = (int)local_1a0;
    if (bVar40 != false) {
      rd_stats->rate = iVar38;
      rd_stats->dist = rd_stats->sse;
      x->plane[0].eobs[block] = 0;
      iVar38 = (x->e_mbd).tx_type_map_stride;
      (x->e_mbd).tx_type_map[iVar38 * blk_row + iVar25] = '\0';
      iVar18 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
      pMVar23 = (MACROBLOCK *)(long)*(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
      if (((0x41010UL >> (uVar39 & 0x3f) & 1) != 0) || ((0x20810UL >> (uVar39 & 0x3f) & 1) != 0)) {
        lVar11 = (long)iVar38 * (long)local_1b0 + local_180;
        lVar13 = 0;
        do {
          lVar33 = 0;
          do {
            (x->e_mbd).tx_type_map[lVar33 + lVar11] = '\0';
            lVar33 = lVar33 + 4;
          } while (lVar33 < iVar18);
          lVar13 = lVar13 + 4;
          lVar11 = lVar11 + (long)iVar38 * 4;
        } while (lVar13 < (long)pMVar23);
      }
    }
    rd_stats->skip_txfm = bVar40;
    iVar38 = (uint)bVar41 * blk_row + iVar25;
    (x->txfm_search_info).blk_skip[iVar38] = (x->txfm_search_info).blk_skip[iVar38] & 0xfe | bVar40;
    if (uVar30 != 0) {
      rd_stats->rate = rd_stats->rate + (x->mode_costs).txfm_partition_cost[lVar28][0];
    }
    lVar11 = rd_stats->dist * 0x80 + ((long)x->rdmult * (long)rd_stats->rate + 0x100 >> 9);
    puVar3 = x->plane[0].txb_entropy_ctx;
    local_184 = (undefined4)CONCAT71((int7)((ulong)puVar3 >> 8),puVar3[block]);
    uVar19 = CONCAT71(uVar21,(x->e_mbd).tx_type_map
                             [(x->e_mbd).tx_type_map_stride * blk_row + iVar25]);
    iVar38 = (cpi->sf).tx_sf.adaptive_txb_search_level;
    uVar31 = (uint)local_198;
    if (iVar38 != 0) {
      cVar9 = (char)iVar38;
      if (ref_best_rd < lVar11 - (lVar11 >> (cVar9 + 1U & 0x3f))) goto LAB_00240f64;
      pMVar23 = (MACROBLOCK *)(lVar11 >> (cVar9 + 2U & 0x3f));
      if (prev_level_rd < lVar11 - (long)pMVar23) {
        uVar31 = 0;
      }
    }
    bVar41 = (byte)pMVar23;
    if (((cpi->sf).tx_sf.txb_split_cap != 0) && (x->plane[0].eobs[block] == 0)) {
      uVar31 = 0;
    }
  }
  else {
    uVar19 = CONCAT71(uVar21,0x10);
    local_184 = 0;
    lVar11 = 0x7fffffffffffffff;
    iVar25 = (int)local_1a0;
    data = local_1b0;
  }
  fVar45 = SUB84(data,0);
  uVar35 = 0x7fffffffffffffff;
  uVar36 = uVar31;
  if ((((x->e_mbd).bd == 8) && (uVar31 != 0)) &&
     ((uVar36 = 1, ref_best_rd != 0x7fffffffffffffff || (lVar11 != 0x7fffffffffffffff)))) {
    uVar30 = (cpi->sf).tx_sf.tx_type_search.ml_tx_split_thresh;
    uVar35 = (ulong)uVar30;
    if (-1 < (int)uVar30) {
      if (tx_size == '\0') {
        uVar36 = uVar31;
        iVar25 = -1;
      }
      else {
        bVar41 = block_size_wide[uVar10];
        local_228 = av1_tx_split_nnconfig_map[uVar39];
        data = x->plane[0].src_diff + (long)local_1b0 * (ulong)bVar41 * 4 + (long)(iVar25 * 4);
        local_198 = (TXFM_CONTEXT *)CONCAT44(local_198._4_4_,uVar31);
        memset(features,0,0x100);
        get_mean_dev_features(data,(uint)bVar41,uVar32,(int)local_1a8,features);
        x_sum = 0;
        pNVar24 = local_228;
        (*av1_nn_predict)(features,local_228,1,(float *)&x_sum);
        bVar41 = (byte)pNVar24;
        iVar38 = 80000;
        if ((int)((float)x_sum * 10000.0) < 80000) {
          iVar38 = (int)((float)x_sum * 10000.0);
        }
        uVar36 = (uint)local_198;
        iVar25 = -80000;
        if (-80000 < iVar38) {
          iVar25 = iVar38;
        }
      }
      fVar45 = SUB84(data,0);
      uVar35 = (ulong)-uVar30;
      if (SBORROW4(iVar25,-uVar30) != (int)(iVar25 + uVar30) < 0) {
        uVar36 = 0;
      }
    }
  }
  uVar17 = (uint8_t)uVar19;
  if (uVar36 == 0) {
    lVar28 = 0x7fffffffffffffff;
  }
  else {
    if (lVar11 < ref_best_rd) {
      ref_best_rd = lVar11;
    }
    uVar36 = (uint)block_size_high[uVar10];
    iVar25 = (x->e_mbd).mb_to_bottom_edge;
    if (iVar25 < 0) {
      uVar36 = (uint)block_size_high[uVar10] +
               (iVar25 >> ((char)(x->e_mbd).plane[0].subsampling_y + 3U & 0x1f));
    }
    uVar31 = (uint)block_size_wide[uVar10];
    iVar25 = (x->e_mbd).mb_to_right_edge;
    if (iVar25 < 0) {
      uVar31 = (uint)block_size_wide[uVar10] +
               (iVar25 >> ((char)(x->e_mbd).plane[0].subsampling_x + 3U & 0x1f));
    }
    iVar22 = (int)uVar36 >> 2;
    iVar26 = (int)uVar31 >> 2;
    iVar25 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    iVar38 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    bVar41 = ""[uVar39];
    local_148 = (int16_t *)CONCAT44(local_148._4_4_,(uint)bVar41);
    iVar18 = tx_size_wide_unit[bVar41];
    iVar27 = tx_size_high_unit[bVar41];
    local_228._0_4_ = (x->mode_costs).txfm_partition_cost[lVar28][1];
    local_198 = (TXFM_CONTEXT *)CONCAT44(local_198._4_4_,iVar25);
    local_170 = (MACROBLOCK *)CONCAT44(local_170._4_4_,iVar27);
    local_140 = (ulong)((int)local_140 + 1);
    local_150 = (ulong)((iVar38 / iVar27) * (iVar25 / iVar18));
    bVar41 = 1;
    iVar25 = 0;
    fVar45 = 0.0;
    uVar35 = 0;
    lVar28 = 0;
    uVar19 = 0;
    local_178 = CONCAT44(local_178._4_4_,iVar22);
    local_158 = CONCAT44(local_158._4_4_,iVar26);
    local_204 = block;
    do {
      uVar36 = 0;
      if (iVar25 + blk_row < iVar22) {
        do {
          iVar12 = (int)local_1a0 + uVar36;
          iVar22 = 7;
          if (iVar12 < iVar26) {
            local_160 = CONCAT71(local_160._1_7_,bVar41);
            x_sum = 1;
            select_tx_block(cpi,x,iVar25 + blk_row,iVar12,local_204,(TX_SIZE)local_148,
                            (int)local_140,plane_bsize,ta,tl,tx_above,tx_left,(RD_STATS *)features,
                            lVar11 / (long)local_150,ref_best_rd - lVar28,&x_sum,
                            (FAST_TX_SEARCH_MODE)local_168);
            iVar22 = 1;
            if (x_sum == 0) {
              lVar28 = 0x7fffffffffffffff;
              bVar41 = (byte)local_160;
            }
            else {
              iVar26 = 0x7fffffff;
              bVar41 = 0;
              if ((int)local_228 == 0x7fffffff) {
                uVar15 = 0x7fffffffffffffff;
                uVar20 = 0x7fffffffffffffff;
                fVar48 = 0.0;
              }
              else {
                bVar41 = 0;
                uVar15 = 0x7fffffffffffffff;
                uVar20 = uVar15;
                fVar48 = 0.0;
                if ((long)(int)features[0] != 0x7fffffff) {
                  lVar28 = (long)(int)features[0] + (long)(int)local_228;
                  if (0x7ffffffe < lVar28) {
                    lVar28 = 0x7fffffff;
                  }
                  if (fVar45 == 0.0) {
                    fVar45 = features[1];
                  }
                  uVar20 = uVar19 + features._8_8_;
                  lVar13 = 0;
                  if (features._24_8_ != 0x7fffffffffffffff) {
                    lVar13 = features._24_8_;
                  }
                  uVar15 = lVar13 + uVar35;
                  if (uVar35 == 0x7fffffffffffffff) {
                    uVar15 = 0x7fffffffffffffff;
                  }
                  bVar41 = (byte)local_160 & features[8]._0_1_;
                  iVar26 = (int)lVar28;
                  fVar48 = fVar45;
                }
              }
              fVar45 = fVar48;
              lVar28 = uVar20 * 0x80 + ((long)x->rdmult * (long)iVar26 + 0x100 >> 9);
              uVar35 = uVar15;
              uVar19 = uVar20;
              local_228._0_4_ = iVar26;
              if (ref_best_rd < lVar28) {
                lVar28 = 0x7fffffffffffffff;
              }
              else {
                local_204 = local_204 + iVar27 * iVar18;
                iVar22 = 0;
              }
            }
            iVar26 = (int)local_158;
          }
          if ((iVar22 != 7) && (iVar22 != 0)) goto LAB_0024085c;
          uVar36 = uVar36 + iVar18;
        } while ((int)uVar36 < (int)(uint)local_198);
        iVar22 = 5;
LAB_0024085c:
        uVar36 = (uint)(iVar22 == 0 || iVar22 == 5);
        iVar22 = (int)local_178;
      }
      if ((char)uVar36 == '\0') break;
      iVar25 = iVar25 + (int)local_170;
    } while (iVar25 < iVar38);
  }
  if (lVar11 < lVar28) {
    pTVar44 = tx_above + local_180;
    local_198 = tx_left + (long)local_1b0;
    __s = tl + (long)local_1b0;
    x->plane[0].txb_entropy_ctx[block] = (uint8_t)local_184;
    iVar25 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    bVar41 = x->plane[0].txb_entropy_ctx[block];
    memset(ta + local_180,(uint)bVar41,(long)iVar25);
    iVar38 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    memset(__s,(uint)bVar41,(long)iVar38);
    bVar41 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [txsize_to_bsize[uVar39]];
    memset(local_198,(int)local_1a8,
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[uVar39]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[uVar39]] == 0) & 0xff));
    memset(pTVar44,uVar32,(ulong)((uint)bVar41 + (uint)(bVar41 == 0) & 0xff));
    iVar18 = 1;
    if (1 < iVar25) {
      iVar18 = iVar25;
    }
    iVar27 = 1;
    if (1 < iVar38) {
      iVar27 = iVar38;
    }
    bVar41 = av1_get_txb_size_index_tw_h_log2_table[uVar10];
    bVar29 = av1_get_txb_size_index_stride_log2_table[uVar10];
    bVar1 = av1_get_txb_size_index_tw_w_log2_table[uVar10];
    uVar32 = iVar18 - 1;
    iVar26 = 0;
    uVar36 = uVar32 ^ 0x80000000;
    uVar31 = uVar32 ^ 0x80000000;
    uVar30 = uVar32 ^ 0x80000000;
    uVar32 = uVar32 ^ 0x80000000;
    do {
      iVar22 = (iVar26 + blk_row >> (bVar41 & 0x1f)) << (bVar29 & 0x1f);
      uVar34 = 0;
      uVar37 = 0xc;
      uVar61 = 0xd;
      uVar62 = 0xe;
      uVar63 = 0xf;
      uVar57 = 8;
      uVar58 = 9;
      uVar59 = 10;
      uVar60 = 0xb;
      uVar53 = 4;
      uVar54 = 5;
      uVar55 = 6;
      uVar56 = 7;
      uVar49 = 0;
      uVar50 = 1;
      uVar51 = 2;
      uVar52 = 3;
      do {
        bVar40 = (int)uVar31 < (int)(uVar50 ^ 0x80000000);
        auVar64._4_4_ = -(uint)((int)uVar30 < (int)(uVar51 ^ 0x80000000));
        auVar64._0_4_ = -(uint)bVar40;
        auVar64._8_4_ = -(uint)((int)uVar32 < (int)(uVar52 ^ 0x80000000));
        auVar64._12_4_ = 0;
        iVar12 = (int)local_1a0;
        if ((bool)(~((int)uVar36 < (int)(uVar49 ^ 0x80000000)) & 1)) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34) >> (bVar1 & 0x1f)) + iVar22] = tx_size;
        }
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        if (!bVar40) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 1) >> (bVar1 & 0x1f)) + iVar22] = tx_size;
        }
        auVar64 = (auVar64 << 0x20 ^ auVar5) >> 0x30;
        auVar64 = packsswb(auVar64,auVar64);
        if ((auVar64._0_4_ >> 0x18 & 1) != 0) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 3) >> (bVar1 & 0x1f)) + iVar22] = tx_size;
        }
        auVar65._0_4_ = -(uint)((int)uVar36 < (int)(uVar53 ^ 0x80000000));
        auVar65._4_4_ = -(uint)((int)uVar31 < (int)(uVar54 ^ 0x80000000));
        auVar65._8_4_ = -(uint)((int)uVar30 < (int)(uVar55 ^ 0x80000000));
        auVar65._12_4_ = -(uint)((int)uVar32 < (int)(uVar56 ^ 0x80000000));
        if ((((ushort)auVar65._0_4_ ^ 0xffff) & 1) != 0) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 4) >> (bVar1 & 0x1f)) + iVar22] = tx_size;
        }
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar65 = auVar65 ^ auVar6;
        auVar68._0_8_ = auVar65._0_8_ << 0x30;
        auVar68._8_8_ = auVar65._8_8_ << 0x30 | auVar65._0_8_ >> 0x10;
        auVar64 = packsswb(auVar68,auVar68);
        if ((auVar64._4_2_ >> 8 & 1) != 0) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 5) >> (bVar1 & 0x1f)) + iVar22] = tx_size;
        }
        if ((auVar65 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 6) >> (bVar1 & 0x1f)) + iVar22] = tx_size;
        }
        if ((auVar65._11_2_ >> 8 & 1) != 0) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 7) >> (bVar1 & 0x1f)) + iVar22] = tx_size;
        }
        auVar66._0_4_ = -(uint)((int)uVar36 < (int)(uVar57 ^ 0x80000000));
        auVar66._4_4_ = -(uint)((int)uVar31 < (int)(uVar58 ^ 0x80000000));
        auVar66._8_4_ = -(uint)((int)uVar30 < (int)(uVar59 ^ 0x80000000));
        auVar66._12_4_ = -(uint)((int)uVar32 < (int)(uVar60 ^ 0x80000000));
        if ((((ushort)auVar66._0_4_ ^ 0xffff) & 1) != 0) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 8) >> (bVar1 & 0x1f)) + iVar22] = tx_size;
        }
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        if ((SUB162(auVar66 ^ auVar7,3) >> 8 & 1) != 0) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 9) >> (bVar1 & 0x1f)) + iVar22] = tx_size;
        }
        auVar64 = pshufhw(auVar66,auVar66,0);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        if (((auVar64 ^ auVar8) & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 10) >> (bVar1 & 0x1f)) + iVar22] = tx_size;
        }
        auVar64 = packsswb(auVar64 ^ auVar8,(auVar66 ^ auVar7) >> 0x30);
        if ((auVar64._10_2_ >> 8 & 1) != 0) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 0xb) >> (bVar1 & 0x1f)) + iVar22] = tx_size
          ;
        }
        auVar67._0_4_ = -(uint)((int)uVar36 < (int)(uVar37 ^ 0x80000000));
        auVar67._4_4_ = -(uint)((int)uVar31 < (int)(uVar61 ^ 0x80000000));
        auVar67._8_4_ = -(uint)((int)uVar30 < (int)(uVar62 ^ 0x80000000));
        auVar67._12_4_ = -(uint)((int)uVar32 < (int)(uVar63 ^ 0x80000000));
        if ((((ushort)auVar67._0_4_ ^ 0xffff) & 1) != 0) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 0xc) >> (bVar1 & 0x1f)) + iVar22] = tx_size
          ;
        }
        auVar69._8_4_ = 0xffffffff;
        auVar69._0_8_ = 0xffffffffffffffff;
        auVar69._12_4_ = 0xffffffff;
        auVar69 = auVar67 ^ auVar69;
        auVar70._0_8_ = auVar69._0_8_ << 0x30;
        auVar70._8_8_ = auVar69._8_8_ << 0x30 | auVar69._0_8_ >> 0x10;
        auVar64 = packsswb(auVar70,auVar70);
        if ((auVar64._12_2_ >> 8 & 1) != 0) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 0xd) >> (bVar1 & 0x1f)) + iVar22] = tx_size
          ;
        }
        auVar64 = pshufhw(auVar67,auVar67,0);
        if (((auVar64._14_2_ ^ 0xffff) & 1) != 0) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 0xe) >> (bVar1 & 0x1f)) + iVar22] = tx_size
          ;
        }
        if ((auVar69._14_2_ >> 8 & 1) != 0) {
          pMVar2->inter_tx_size[((int)(iVar12 + uVar34 + 0xf) >> (bVar1 & 0x1f)) + iVar22] = tx_size
          ;
        }
        uVar34 = uVar34 + 0x10;
        uVar49 = uVar49 + 0x10;
        uVar50 = uVar50 + 0x10;
        uVar51 = uVar51 + 0x10;
        uVar52 = uVar52 + 0x10;
        uVar53 = uVar53 + 0x10;
        uVar54 = uVar54 + 0x10;
        uVar55 = uVar55 + 0x10;
        uVar56 = uVar56 + 0x10;
        uVar57 = uVar57 + 0x10;
        uVar58 = uVar58 + 0x10;
        uVar59 = uVar59 + 0x10;
        uVar60 = uVar60 + 0x10;
        uVar37 = uVar37 + 0x10;
        uVar61 = uVar61 + 0x10;
        uVar62 = uVar62 + 0x10;
        uVar63 = uVar63 + 0x10;
      } while ((iVar18 + 0xfU & 0xfffffff0) != uVar34);
      iVar26 = iVar26 + 1;
    } while (iVar26 != iVar27);
    pMVar2->tx_size = tx_size;
    iVar18 = (x->e_mbd).tx_type_map_stride;
    (x->e_mbd).tx_type_map[iVar18 * blk_row + iVar12] = uVar17;
    if (((0x41010UL >> (uVar39 & 0x3f) & 1) != 0) || ((0x20810UL >> (uVar39 & 0x3f) & 1) != 0)) {
      local_180 = (long)local_1b0 * (long)iVar18 + local_180;
      lVar28 = 0;
      do {
        lVar11 = 0;
        do {
          (x->e_mbd).tx_type_map[lVar11 + local_180] = uVar17;
          lVar11 = lVar11 + 4;
        } while (lVar11 < iVar25);
        lVar28 = lVar28 + 4;
        local_180 = local_180 + (long)iVar18 * 4;
      } while (lVar28 < iVar38);
    }
    iVar12 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar10] * blk_row + iVar12;
    bVar41 = (x->txfm_search_info).blk_skip[iVar12];
    if (rd_stats->skip_txfm == '\0') {
      bVar41 = bVar41 & 0xfe;
    }
    else {
      bVar41 = bVar41 | 1;
    }
    (x->txfm_search_info).blk_skip[iVar12] = bVar41;
    return;
  }
  rd_stats->rate = (int)local_228;
  rd_stats->zero_rate = (int)fVar45;
  rd_stats->dist = uVar19;
  rd_stats->rdcost = lVar28;
  rd_stats->sse = uVar35;
  rd_stats->skip_txfm = bVar41;
  if (lVar28 != 0x7fffffffffffffff) {
    return;
  }
LAB_00240f64:
  *is_cost_valid = 0;
  return;
}

Assistant:

static inline void select_tx_block(
    const AV1_COMP *cpi, MACROBLOCK *x, int blk_row, int blk_col, int block,
    TX_SIZE tx_size, int depth, BLOCK_SIZE plane_bsize, ENTROPY_CONTEXT *ta,
    ENTROPY_CONTEXT *tl, TXFM_CONTEXT *tx_above, TXFM_CONTEXT *tx_left,
    RD_STATS *rd_stats, int64_t prev_level_rd, int64_t ref_best_rd,
    int *is_cost_valid, FAST_TX_SEARCH_MODE ftxs_mode) {
  assert(tx_size < TX_SIZES_ALL);
  av1_init_rd_stats(rd_stats);
  if (ref_best_rd < 0) {
    *is_cost_valid = 0;
    return;
  }

  MACROBLOCKD *const xd = &x->e_mbd;
  assert(blk_row < max_block_high(xd, plane_bsize, 0) &&
         blk_col < max_block_wide(xd, plane_bsize, 0));
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int ctx = txfm_partition_context(tx_above + blk_col, tx_left + blk_row,
                                         mbmi->bsize, tx_size);
  struct macroblock_plane *const p = &x->plane[0];

  int try_no_split = (cpi->oxcf.txfm_cfg.enable_tx64 ||
                      txsize_sqr_up_map[tx_size] != TX_64X64) &&
                     (cpi->oxcf.txfm_cfg.enable_rect_tx ||
                      tx_size_wide[tx_size] == tx_size_high[tx_size]);
  int try_split = tx_size > TX_4X4 && depth < MAX_VARTX_DEPTH;
  TxCandidateInfo no_split = { INT64_MAX, 0, TX_TYPES };

  // Prune tx_split and no-split based on sub-block properties.
  if (tx_size != TX_4X4 && try_split == 1 && try_no_split == 1 &&
      cpi->sf.tx_sf.prune_tx_size_level > 0) {
    prune_tx_split_no_split(x, plane_bsize, blk_row, blk_col, tx_size,
                            &try_no_split, &try_split,
                            cpi->sf.tx_sf.prune_tx_size_level);
  }

  if (cpi->sf.rt_sf.skip_tx_no_split_var_based_partition) {
    if (x->try_merge_partition && try_split && p->eobs[block]) try_no_split = 0;
  }

  // Try using current block as a single transform block without split.
  if (try_no_split) {
    try_tx_block_no_split(cpi, x, blk_row, blk_col, block, tx_size, depth,
                          plane_bsize, ta, tl, ctx, rd_stats, ref_best_rd,
                          ftxs_mode, &no_split);

    // Speed features for early termination.
    const int search_level = cpi->sf.tx_sf.adaptive_txb_search_level;
    if (search_level) {
      if ((no_split.rd - (no_split.rd >> (1 + search_level))) > ref_best_rd) {
        *is_cost_valid = 0;
        return;
      }
      if (no_split.rd - (no_split.rd >> (2 + search_level)) > prev_level_rd) {
        try_split = 0;
      }
    }
    if (cpi->sf.tx_sf.txb_split_cap) {
      if (p->eobs[block] == 0) try_split = 0;
    }
  }

  // ML based speed feature to skip searching for split transform blocks.
  if (x->e_mbd.bd == 8 && try_split &&
      !(ref_best_rd == INT64_MAX && no_split.rd == INT64_MAX)) {
    const int threshold = cpi->sf.tx_sf.tx_type_search.ml_tx_split_thresh;
    if (threshold >= 0) {
      const int split_score =
          ml_predict_tx_split(x, plane_bsize, blk_row, blk_col, tx_size);
      if (split_score < -threshold) try_split = 0;
    }
  }

  RD_STATS split_rd_stats;
  split_rd_stats.rdcost = INT64_MAX;
  // Try splitting current block into smaller transform blocks.
  if (try_split) {
    try_tx_block_split(cpi, x, blk_row, blk_col, block, tx_size, depth,
                       plane_bsize, ta, tl, tx_above, tx_left, ctx, no_split.rd,
                       AOMMIN(no_split.rd, ref_best_rd), ftxs_mode,
                       &split_rd_stats);
  }

  if (no_split.rd < split_rd_stats.rdcost) {
    ENTROPY_CONTEXT *pta = ta + blk_col;
    ENTROPY_CONTEXT *ptl = tl + blk_row;
    p->txb_entropy_ctx[block] = no_split.txb_entropy_ctx;
    av1_set_txb_context(x, 0, block, tx_size, pta, ptl);
    txfm_partition_update(tx_above + blk_col, tx_left + blk_row, tx_size,
                          tx_size);
    for (int idy = 0; idy < tx_size_high_unit[tx_size]; ++idy) {
      for (int idx = 0; idx < tx_size_wide_unit[tx_size]; ++idx) {
        const int index =
            av1_get_txb_size_index(plane_bsize, blk_row + idy, blk_col + idx);
        mbmi->inter_tx_size[index] = tx_size;
      }
    }
    mbmi->tx_size = tx_size;
    update_txk_array(xd, blk_row, blk_col, tx_size, no_split.tx_type);
    const int bw = mi_size_wide[plane_bsize];
    set_blk_skip(x->txfm_search_info.blk_skip, 0, blk_row * bw + blk_col,
                 rd_stats->skip_txfm);
  } else {
    *rd_stats = split_rd_stats;
    if (split_rd_stats.rdcost == INT64_MAX) *is_cost_valid = 0;
  }
}